

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructions.c
# Opt level: O3

void parse_opt_arg(pExecutor exec,Expr expr,Expr *arg,Expr *def)

{
  anon_union_8_8_707b72ea_for_Expr_1 aVar1;
  undefined4 uVar2;
  Expr *__ptr;
  int len;
  int local_14;
  
  if (expr.type == VT_ATOM) {
    arg->type = VT_ATOM;
    (arg->field_1).val_atom = (size_t)expr.field_1;
    uVar2 = *(undefined4 *)&(exec->nil).field_0x4;
    aVar1 = (exec->nil).field_1;
    def->type = (exec->nil).type;
    *(undefined4 *)&def->field_0x4 = uVar2;
    def->field_1 = aVar1;
  }
  else {
    __ptr = get_list(exec,expr,&local_14);
    uVar2 = *(undefined4 *)&__ptr->field_0x4;
    aVar1 = __ptr->field_1;
    arg->type = __ptr->type;
    *(undefined4 *)&arg->field_0x4 = uVar2;
    arg->field_1 = aVar1;
    uVar2 = *(undefined4 *)&__ptr[1].field_0x4;
    aVar1 = __ptr[1].field_1;
    def->type = __ptr[1].type;
    *(undefined4 *)&def->field_0x4 = uVar2;
    def->field_1 = aVar1;
    free(__ptr);
  }
  return;
}

Assistant:

void parse_opt_arg(pExecutor exec, Expr expr, Expr *arg, Expr *def)
{
    if (expr.type == VT_ATOM)
    {
        *arg = expr;
        *def = exec->nil;
    }
    else // VT_PAIR
    {
        int len;
        Expr *list = get_list(exec, expr, &len);
        *arg = list[0];
        *def = list[1];
        free(list);
    }
}